

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTargetInternals::cmTargetInternals(cmTargetInternals *this)

{
  static_string_view propertyName;
  FileSetEntries local_300;
  string_view local_2d8;
  FileSetEntries local_2c8;
  string_view local_2a0;
  string_view local_290;
  string_view local_280;
  string_view local_270;
  string_view local_260;
  string_view local_250;
  string_view local_240;
  string_view local_230;
  string_view local_220;
  FileSetEntries local_210;
  string_view local_1e8;
  FileSetEntries local_1d8;
  string_view local_1b0;
  string_view local_1a0;
  string_view local_190;
  string_view local_180;
  string_view local_170;
  string_view local_160;
  string_view local_150;
  string_view local_140;
  string_view local_130;
  string_view local_120;
  string_view local_110;
  string_view local_100;
  string_view local_f0;
  string_view local_e0;
  string_view local_d0;
  string_view local_c0;
  string_view local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  cmTargetInternals *local_10;
  cmTargetInternals *this_local;
  
  local_10 = this;
  cmPolicies::PolicyMap::PolicyMap(&this->PolicyMap);
  std::__cxx11::string::string((string *)&this->Name);
  std::__cxx11::string::string((string *)&this->InstallPath);
  std::__cxx11::string::string((string *)&this->RuntimeInstallPath);
  cmPropertyMap::cmPropertyMap(&this->Properties);
  std::
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  ::set(&this->Utilities);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PreBuildCommands);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PreLinkCommands);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PostBuildCommands);
  std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::vector
            (&this->InstallGenerators);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SystemIncludeDirectories);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ::vector(&this->OriginalLinkLibraries);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::map(&this->LanguageStandardProperties);
  std::
  map<const_cmTargetExport_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_cmTargetExport_*>,_std::allocator<std::pair<const_cmTargetExport_*const,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map(&this->InstallIncludeDirectoriesEntries);
  std::
  vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ::vector(&this->TLLCommands);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>_>
  ::map(&this->FileSets);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace);
  cmFindPackageStack::cmFindPackageStack(&this->FindPackageStack);
  local_30 = (string_view)::cm::operator____s("INCLUDE_DIRECTORIES",0x13);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->IncludeDirectories,(static_string_view)local_30,No);
  local_40 = (string_view)::cm::operator____s("COMPILE_OPTIONS",0xf);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->CompileOptions,(static_string_view)local_40,No);
  local_50 = (string_view)::cm::operator____s("COMPILE_FEATURES",0x10);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->CompileFeatures,(static_string_view)local_50,No);
  local_60 = (string_view)::cm::operator____s("COMPILE_DEFINITIONS",0x13);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->CompileDefinitions,(static_string_view)local_60,No);
  local_70 = (string_view)::cm::operator____s("PRECOMPILE_HEADERS",0x12);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->PrecompileHeaders,(static_string_view)local_70,No);
  local_80 = (string_view)::cm::operator____s("SOURCES",7);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->Sources,(static_string_view)local_80,Yes);
  local_90 = (string_view)::cm::operator____s("LINK_OPTIONS",0xc);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->LinkOptions,(static_string_view)local_90,No);
  local_a0 = (string_view)::cm::operator____s("LINK_DIRECTORIES",0x10);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->LinkDirectories,(static_string_view)local_a0,No);
  local_b0 = (string_view)::cm::operator____s("LINK_LIBRARIES",0xe);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->LinkLibraries,(static_string_view)local_b0,No);
  local_c0 = (string_view)::cm::operator____s("INTERFACE_LINK_LIBRARIES",0x18);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->InterfaceLinkLibraries,(static_string_view)local_c0,No);
  local_d0 = (string_view)::cm::operator____s("INTERFACE_LINK_LIBRARIES_DIRECT",0x1f);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->InterfaceLinkLibrariesDirect,(static_string_view)local_d0,No);
  local_e0 = (string_view)::cm::operator____s("INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE",0x27);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->InterfaceLinkLibrariesDirectExclude,(static_string_view)local_e0,No);
  local_f0 = (string_view)::cm::operator____s("IMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES",0x28);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->ImportedCxxModulesIncludeDirectories,(static_string_view)local_f0,No);
  local_100 = (string_view)::cm::operator____s("IMPORTED_CXX_MODULES_COMPILE_DEFINITIONS",0x28);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->ImportedCxxModulesCompileDefinitions,(static_string_view)local_100,No);
  local_110 = (string_view)::cm::operator____s("IMPORTED_CXX_MODULES_COMPILE_FEATURES",0x25);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->ImportedCxxModulesCompileFeatures,(static_string_view)local_110,No);
  local_120 = (string_view)::cm::operator____s("IMPORTED_CXX_MODULES_COMPILE_OPTIONS",0x24);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->ImportedCxxModulesCompileOptions,(static_string_view)local_120,No);
  local_130 = (string_view)::cm::operator____s("IMPORTED_CXX_MODULES_LINK_LIBRARIES",0x23);
  anon_unknown.dwarf_94103c::UsageRequirementProperty::UsageRequirementProperty
            (&this->ImportedCxxModulesLinkLibraries,(static_string_view)local_130,No);
  local_140 = (string_view)::cm::operator____s("HEADERS",7);
  local_150 = (string_view)::cm::operator____s("HEADER_DIRS",0xb);
  local_160 = (string_view)::cm::operator____s("HEADER_SET",10);
  local_170 = (string_view)::cm::operator____s("HEADER_DIRS_",0xc);
  local_180 = (string_view)::cm::operator____s("HEADER_SET_",0xb);
  local_190 = (string_view)::cm::operator____s("Header",6);
  local_1a0 = (string_view)::cm::operator____s("The default header set",0x16);
  local_1b0 = (string_view)::cm::operator____s("Header set",10);
  local_1e8 = (string_view)::cm::operator____s("HEADER_SETS",0xb);
  anon_unknown.dwarf_94103c::FileSetEntries::FileSetEntries
            (&local_1d8,(static_string_view)local_1e8);
  local_220 = (string_view)::cm::operator____s("INTERFACE_HEADER_SETS",0x15);
  anon_unknown.dwarf_94103c::FileSetEntries::FileSetEntries
            (&local_210,(static_string_view)local_220);
  anon_unknown.dwarf_94103c::FileSetType::FileSetType
            (&this->HeadersFileSets,(static_string_view)local_140,(static_string_view)local_150,
             (static_string_view)local_160,(static_string_view)local_170,
             (static_string_view)local_180,(static_string_view)local_190,
             (static_string_view)local_1a0,(static_string_view)local_1b0,&local_1d8,&local_210);
  anon_unknown.dwarf_94103c::FileSetEntries::~FileSetEntries(&local_210);
  anon_unknown.dwarf_94103c::FileSetEntries::~FileSetEntries(&local_1d8);
  local_230 = (string_view)::cm::operator____s("CXX_MODULES",0xb);
  local_240 = (string_view)::cm::operator____s("CXX_MODULE_DIRS",0xf);
  local_250 = (string_view)::cm::operator____s("CXX_MODULE_SET",0xe);
  local_260 = (string_view)::cm::operator____s("CXX_MODULE_DIRS_",0x10);
  local_270 = (string_view)::cm::operator____s("CXX_MODULE_SET_",0xf);
  local_280 = (string_view)::cm::operator____s("C++ module",10);
  local_290 = (string_view)::cm::operator____s("The default C++ module set",0x1a);
  local_2a0 = (string_view)::cm::operator____s("C++ module set",0xe);
  local_2d8 = (string_view)::cm::operator____s("CXX_MODULE_SETS",0xf);
  anon_unknown.dwarf_94103c::FileSetEntries::FileSetEntries
            (&local_2c8,(static_string_view)local_2d8);
  propertyName = ::cm::operator____s("INTERFACE_CXX_MODULE_SETS",0x19);
  anon_unknown.dwarf_94103c::FileSetEntries::FileSetEntries(&local_300,propertyName);
  anon_unknown.dwarf_94103c::FileSetType::FileSetType
            (&this->CxxModulesFileSets,(static_string_view)local_230,(static_string_view)local_240,
             (static_string_view)local_250,(static_string_view)local_260,
             (static_string_view)local_270,(static_string_view)local_280,
             (static_string_view)local_290,(static_string_view)local_2a0,&local_2c8,&local_300);
  anon_unknown.dwarf_94103c::FileSetEntries::~FileSetEntries(&local_300);
  anon_unknown.dwarf_94103c::FileSetEntries::~FileSetEntries(&local_2c8);
  return;
}

Assistant:

cmTargetInternals::cmTargetInternals()
  : IncludeDirectories("INCLUDE_DIRECTORIES"_s)
  , CompileOptions("COMPILE_OPTIONS"_s)
  , CompileFeatures("COMPILE_FEATURES"_s)
  , CompileDefinitions("COMPILE_DEFINITIONS"_s)
  , PrecompileHeaders("PRECOMPILE_HEADERS"_s)
  , Sources("SOURCES"_s, UsageRequirementProperty::AppendEmpty::Yes)
  , LinkOptions("LINK_OPTIONS"_s)
  , LinkDirectories("LINK_DIRECTORIES"_s)
  , LinkLibraries("LINK_LIBRARIES"_s)
  , InterfaceLinkLibraries("INTERFACE_LINK_LIBRARIES"_s)
  , InterfaceLinkLibrariesDirect("INTERFACE_LINK_LIBRARIES_DIRECT"_s)
  , InterfaceLinkLibrariesDirectExclude(
      "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE"_s)
  , ImportedCxxModulesIncludeDirectories(
      "IMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES"_s)
  , ImportedCxxModulesCompileDefinitions(
      "IMPORTED_CXX_MODULES_COMPILE_DEFINITIONS"_s)
  , ImportedCxxModulesCompileFeatures(
      "IMPORTED_CXX_MODULES_COMPILE_FEATURES"_s)
  , ImportedCxxModulesCompileOptions("IMPORTED_CXX_MODULES_COMPILE_OPTIONS"_s)
  , ImportedCxxModulesLinkLibraries("IMPORTED_CXX_MODULES_LINK_LIBRARIES"_s)
  , HeadersFileSets("HEADERS"_s, "HEADER_DIRS"_s, "HEADER_SET"_s,
                    "HEADER_DIRS_"_s, "HEADER_SET_"_s, "Header"_s,
                    "The default header set"_s, "Header set"_s,
                    FileSetEntries("HEADER_SETS"_s),
                    FileSetEntries("INTERFACE_HEADER_SETS"_s))
  , CxxModulesFileSets("CXX_MODULES"_s, "CXX_MODULE_DIRS"_s,
                       "CXX_MODULE_SET"_s, "CXX_MODULE_DIRS_"_s,
                       "CXX_MODULE_SET_"_s, "C++ module"_s,
                       "The default C++ module set"_s, "C++ module set"_s,
                       FileSetEntries("CXX_MODULE_SETS"_s),
                       FileSetEntries("INTERFACE_CXX_MODULE_SETS"_s))
{
}